

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::inNameHex1(Tokenizer *this,char ch)

{
  byte bVar1;
  
  this->hex_char = ch;
  bVar1 = ch - 0x30U;
  if (9 < (byte)(ch - 0x30U)) {
    if (ch < 'a') {
      bVar1 = 0x10;
      if ('@' < ch) {
        bVar1 = ch - 0x37;
      }
    }
    else {
      bVar1 = ch + 0xa9;
    }
  }
  if ((char)bVar1 < '\x10') {
    this->char_code = (int)(char)bVar1 << 4;
    this->state = st_name_hex2;
    return;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,0x27d1e7);
  std::__cxx11::string::push_back((char)this + '\x10');
  this->state = st_name;
  inName(this,ch);
  return;
}

Assistant:

void
Tokenizer::inNameHex1(char ch)
{
    hex_char = ch;

    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code = int(hval) << 4;
        state = st_name_hex2;
    } else {
        QTC::TC("qpdf", "QPDFTokenizer bad name 1");
        error_message = "name with stray # will not work with PDF >= 1.2";
        // Use null to encode a bad # -- this is reversed in QPDF_Name::normalizeName.
        val += '\0';
        state = st_name;
        inName(ch);
    }
}